

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::pumpTo
          (AbortedRead *this,AsyncOutputStream *output,uint64_t amount)

{
  char (*in_RCX) [28];
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            ((String *)&local_1c0,(Debug *)"\"abortRead() has been called\"",
             "abortRead() has been called",in_RCX);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x594,(String *)&local_1c0);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }